

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsview.cpp
# Opt level: O2

void __thiscall QGraphicsViewPrivate::recalculateContentSize(QGraphicsViewPrivate *this)

{
  double dVar1;
  double dVar2;
  ScrollBarPolicy SVar3;
  QWidget *this_00;
  double dVar4;
  qreal qVar5;
  qreal qVar6;
  bool bVar7;
  int iVar8;
  int iVar9;
  int max;
  uint uVar10;
  QSize QVar11;
  QStyle *pQVar12;
  int iVar13;
  Representation RVar14;
  Representation RVar15;
  Representation RVar16;
  Representation RVar17;
  long in_FS_OFFSET;
  bool bVar18;
  QRectF local_78;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)
             &(this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.super_QWidgetPrivate.
              field_0x8;
  QVar11 = QAbstractScrollArea::maximumViewportSize((QAbstractScrollArea *)this_00);
  local_48 = 0xffffffff;
  uStack_44 = 0xffffffff;
  uStack_40 = 0xffffffff;
  uStack_3c = 0xffffffff;
  local_58 = 0xffffffff;
  uStack_54 = 0xffffffff;
  uStack_50 = 0xffffffff;
  uStack_4c = 0xffffffff;
  QGraphicsView::sceneRect(&local_78,(QGraphicsView *)this_00);
  QTransform::mapRect((QRectF *)&local_58);
  pQVar12 = QWidget::style(this_00);
  iVar8 = (**(code **)(*(long *)pQVar12 + 0xf0))(pQVar12,0x11,0,this_00,0);
  RVar16 = QVar11.ht.m_i;
  RVar14 = QVar11.wd.m_i;
  RVar17.m_i = RVar14.m_i;
  RVar15.m_i = RVar16.m_i;
  if (iVar8 != 0) {
    iVar13 = (this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.frameWidth * 2;
    iVar9 = 0;
    if ((this->super_QAbstractScrollAreaPrivate).hbarpolicy == ScrollBarAlwaysOn) {
      iVar9 = iVar13;
    }
    RVar15.m_i = RVar16.m_i - iVar9;
    if ((this->super_QAbstractScrollAreaPrivate).vbarpolicy != ScrollBarAlwaysOn) {
      iVar13 = 0;
    }
    RVar17.m_i = RVar14.m_i - iVar13;
  }
  pQVar12 = QWidget::style(this_00);
  iVar9 = (**(code **)(*(long *)pQVar12 + 0xe0))(pQVar12,9,0,this_00);
  iVar13 = (this->super_QAbstractScrollAreaPrivate).super_QFramePrivate.frameWidth * 2;
  if (iVar8 == 0) {
    iVar13 = 0;
  }
  iVar13 = iVar13 + iVar9;
  dVar1 = (double)CONCAT44(uStack_44,local_48);
  SVar3 = (this->super_QAbstractScrollAreaPrivate).hbarpolicy;
  bVar18 = (this->super_QAbstractScrollAreaPrivate).vbarpolicy == ScrollBarAsNeeded;
  bVar7 = (double)RVar15.m_i < (double)CONCAT44(uStack_3c,uStack_40) && bVar18;
  if ((bVar18 && (SVar3 == ScrollBarAsNeeded && (double)RVar17.m_i < dVar1)) &&
     ((double)(RVar15.m_i - iVar13) < (double)CONCAT44(uStack_3c,uStack_40))) {
    bVar7 = true;
  }
  if (((!(bool)(SVar3 == ScrollBarAsNeeded & bVar7)) ||
      (iVar8 = iVar13, dVar1 <= (double)(RVar17.m_i - iVar13))) &&
     (iVar8 = 0, SVar3 == ScrollBarAsNeeded && (double)RVar17.m_i < dVar1)) {
    iVar8 = iVar13;
  }
  iVar8 = RVar15.m_i - iVar8;
  iVar9 = 0;
  if (bVar7) {
    iVar9 = iVar13;
  }
  iVar9 = RVar17.m_i - iVar9;
  qVar5 = (this->lastCenterPoint).xp;
  qVar6 = (this->lastCenterPoint).yp;
  dVar1 = this->leftIndent;
  dVar2 = this->topIndent;
  iVar13 = q_round_bound((qreal)CONCAT44(uStack_54,local_58));
  max = q_round_bound(((double)CONCAT44(uStack_54,local_58) + (double)CONCAT44(uStack_44,local_48))
                      - (double)iVar9);
  if (iVar13 < max) {
    this->leftIndent = 0.0;
    QAbstractSlider::setRange
              (&((this->super_QAbstractScrollAreaPrivate).hbar)->super_QAbstractSlider,iVar13,max);
    QAbstractSlider::setPageStep
              (&((this->super_QAbstractScrollAreaPrivate).hbar)->super_QAbstractSlider,iVar9);
    QAbstractSlider::setSingleStep
              (&((this->super_QAbstractScrollAreaPrivate).hbar)->super_QAbstractSlider,iVar9 / 0x14)
    ;
    if ((dVar1 != 0.0) || (NAN(dVar1))) {
      QAbstractSlider::setValue
                (&((this->super_QAbstractScrollAreaPrivate).hbar)->super_QAbstractSlider,(int)-dVar1
                );
    }
  }
  else {
    uVar10 = (this->alignment).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
             super_QFlagsStorage<Qt::AlignmentFlag>.i & 0x1f;
    if (uVar10 == 2) {
      dVar4 = (((double)RVar14.m_i - (double)CONCAT44(uStack_44,local_48)) -
              (double)CONCAT44(uStack_54,local_58)) + -1.0;
    }
    else if (uVar10 == 1) {
      dVar4 = -(double)CONCAT44(uStack_54,local_58);
    }
    else {
      dVar4 = ((double)CONCAT44(uStack_44,local_48) + (double)CONCAT44(uStack_54,local_58) +
              (double)CONCAT44(uStack_54,local_58)) * -0.5 +
              (double)(int)((long)((ulong)(uint)(RVar14.m_i >> 0x1f) << 0x20 |
                                  (ulong)QVar11 & 0xffffffff) / 2);
    }
    this->leftIndent = dVar4;
    QAbstractSlider::setRange
              (&((this->super_QAbstractScrollAreaPrivate).hbar)->super_QAbstractSlider,0,0);
  }
  iVar13 = q_round_bound((qreal)CONCAT44(uStack_4c,uStack_50));
  iVar9 = q_round_bound(((double)CONCAT44(uStack_4c,uStack_50) +
                        (double)CONCAT44(uStack_3c,uStack_40)) - (double)iVar8);
  if (iVar13 < iVar9) {
    this->topIndent = 0.0;
    QAbstractSlider::setRange
              (&((this->super_QAbstractScrollAreaPrivate).vbar)->super_QAbstractSlider,iVar13,iVar9)
    ;
    QAbstractSlider::setPageStep
              (&((this->super_QAbstractScrollAreaPrivate).vbar)->super_QAbstractSlider,iVar8);
    QAbstractSlider::setSingleStep
              (&((this->super_QAbstractScrollAreaPrivate).vbar)->super_QAbstractSlider,iVar8 / 0x14)
    ;
    if ((dVar2 != 0.0) || (NAN(dVar2))) {
      QAbstractSlider::setValue
                (&((this->super_QAbstractScrollAreaPrivate).vbar)->super_QAbstractSlider,(int)-dVar2
                );
    }
  }
  else {
    uVar10 = (this->alignment).super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
             super_QFlagsStorage<Qt::AlignmentFlag>.i & 0x1e0;
    if (uVar10 == 0x40) {
      dVar4 = (((double)RVar16.m_i - (double)CONCAT44(uStack_3c,uStack_40)) -
              (double)CONCAT44(uStack_4c,uStack_50)) + -1.0;
    }
    else if (uVar10 == 0x20) {
      dVar4 = -(double)CONCAT44(uStack_4c,uStack_50);
    }
    else {
      dVar4 = ((double)CONCAT44(uStack_3c,uStack_40) + (double)CONCAT44(uStack_4c,uStack_50) +
              (double)CONCAT44(uStack_4c,uStack_50)) * -0.5 +
              (double)(int)((long)((ulong)(uint)(RVar16.m_i >> 0x1f) << 0x20 | (ulong)QVar11 >> 0x20
                                  ) / 2);
    }
    this->topIndent = dVar4;
    QAbstractSlider::setRange
              (&((this->super_QAbstractScrollAreaPrivate).vbar)->super_QAbstractSlider,0,0);
  }
  (this->lastCenterPoint).xp = qVar5;
  (this->lastCenterPoint).yp = qVar6;
  if ((((dVar1 != this->leftIndent) || (NAN(dVar1) || NAN(this->leftIndent))) ||
      (dVar2 != this->topIndent)) || (NAN(dVar2) || NAN(this->topIndent))) {
    this->field_0x300 = this->field_0x300 | 0x20;
    updateAll(this);
  }
  else {
    bVar7 = QWidget::isRightToLeft(this_00);
    if (((bVar7) && (this->leftIndent == 0.0)) && (!NAN(this->leftIndent))) {
      this->field_0x300 = this->field_0x300 | 0x20;
    }
  }
  if (((this->cacheMode).super_QFlagsStorageHelper<QGraphicsView::CacheModeFlag,_4>.
       super_QFlagsStorage<QGraphicsView::CacheModeFlag>.i & 1) != 0) {
    this->field_0x301 = this->field_0x301 | 8;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsViewPrivate::recalculateContentSize()
{
    Q_Q(QGraphicsView);

    const QSize maxSize = q->maximumViewportSize();
    int width = maxSize.width();
    int height = maxSize.height();
    const QRectF viewRect = matrix.mapRect(q->sceneRect());

    bool frameOnlyAround = (q->style()->styleHint(QStyle::SH_ScrollView_FrameOnlyAroundContents, nullptr, q));
    if (frameOnlyAround) {
        if (hbarpolicy == Qt::ScrollBarAlwaysOn)
            height -= frameWidth * 2;
        if (vbarpolicy == Qt::ScrollBarAlwaysOn)
            width -= frameWidth * 2;
    }

    // Adjust the maximum width and height of the viewport based on the width
    // of visible scroll bars.
    const int scrollBarExtent = q->style()->pixelMetric(QStyle::PM_ScrollBarExtent, nullptr, q)
                              + (frameOnlyAround ? frameWidth * 2 : 0);

    // We do not need to subtract the width scrollbars whose policy is
    // Qt::ScrollBarAlwaysOn, this was already done by maximumViewportSize().
    bool useHorizontalScrollBar = (viewRect.width() > width) && hbarpolicy == Qt::ScrollBarAsNeeded;
    bool useVerticalScrollBar = (viewRect.height() > height) && vbarpolicy == Qt::ScrollBarAsNeeded;
    if (useHorizontalScrollBar && vbarpolicy == Qt::ScrollBarAsNeeded) {
        if (viewRect.height() > height - scrollBarExtent)
            useVerticalScrollBar = true;
    }
    if (useVerticalScrollBar && hbarpolicy == Qt::ScrollBarAsNeeded) {
        if (viewRect.width() > width - scrollBarExtent)
            useHorizontalScrollBar = true;
    }
    if (useHorizontalScrollBar)
        height -= scrollBarExtent;
    if (useVerticalScrollBar)
        width -= scrollBarExtent;

    // Setting the ranges of these scroll bars can/will cause the values to
    // change, and scrollContentsBy() will be called correspondingly. This
    // will reset the last center point.
    const QPointF savedLastCenterPoint = lastCenterPoint;

    // Remember the former indent settings
    const qreal oldLeftIndent = leftIndent;
    const qreal oldTopIndent = topIndent;

    // If the whole scene fits horizontally, we center the scene horizontally,
    // and ignore the horizontal scroll bars.
    const int left =  q_round_bound(viewRect.left());
    const int right = q_round_bound(viewRect.right() - width);
    if (left >= right) {
        switch (alignment & Qt::AlignHorizontal_Mask) {
        case Qt::AlignLeft:
            leftIndent = -viewRect.left();
            break;
        case Qt::AlignRight:
            leftIndent = maxSize.width() - viewRect.width() - viewRect.left() - 1;
            break;
        case Qt::AlignHCenter:
        default:
            leftIndent = maxSize.width() / 2 - (viewRect.left() + viewRect.right()) / 2;
            break;
        }

        hbar->setRange(0, 0);
    } else {
        leftIndent = 0;

        hbar->setRange(left, right);
        hbar->setPageStep(width);
        hbar->setSingleStep(width / 20);

        if (oldLeftIndent != 0)
            hbar->setValue(-oldLeftIndent);
    }

    // If the whole scene fits vertically, we center the scene vertically, and
    // ignore the vertical scroll bars.
    const int top = q_round_bound(viewRect.top());
    const int bottom = q_round_bound(viewRect.bottom()  - height);
    if (top >= bottom) {
        switch (alignment & Qt::AlignVertical_Mask) {
        case Qt::AlignTop:
            topIndent = -viewRect.top();
            break;
        case Qt::AlignBottom:
            topIndent = maxSize.height() - viewRect.height() - viewRect.top() - 1;
            break;
        case Qt::AlignVCenter:
        default:
            topIndent = maxSize.height() / 2 - (viewRect.top() + viewRect.bottom()) / 2;
            break;
        }

        vbar->setRange(0, 0);
    } else {
        topIndent = 0;

        vbar->setRange(top, bottom);
        vbar->setPageStep(height);
        vbar->setSingleStep(height / 20);

        if (oldTopIndent != 0)
            vbar->setValue(-oldTopIndent);
    }

    // Restorethe center point from before the ranges changed.
    lastCenterPoint = savedLastCenterPoint;

    // Issue a full update if the indents change.
    // ### If the transform is still the same, we can get away with just a
    // scroll instead.
    if (oldLeftIndent != leftIndent || oldTopIndent != topIndent) {
        dirtyScroll = true;
        updateAll();
    } else if (q->isRightToLeft() && !leftIndent) {
        // In reverse mode, the horizontal scroll always changes after the content
        // size has changed, as the scroll is calculated by summing the min and
        // max values of the range and subtracting the current value. In normal
        // mode the scroll remains unchanged unless the indent has changed.
        dirtyScroll = true;
    }

    if (cacheMode & QGraphicsView::CacheBackground) {
        // Invalidate the background pixmap
        mustResizeBackgroundPixmap = true;
    }
}